

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O1

fileMetrics *
exrmetrics(fileMetrics *__return_storage_ptr__,char *inFileName,char *outFileName,int part,
          Compression compression,float level,int passes,bool write,bool reread,PixelMode pixelMode,
          bool verbose)

{
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  uint64_t *puVar1;
  bool *pbVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  bool bVar7;
  undefined2 uVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  ostream *poVar14;
  Header *pHVar15;
  Compression *pCVar16;
  int *piVar17;
  float *pfVar18;
  _Rb_tree_node_base *p_Var19;
  _Rb_tree_node_base *p_Var20;
  char *pcVar21;
  MultiPartOutputFile *this_02;
  MultiPartInputFile *this_03;
  pointer ppVar22;
  long *plVar23;
  runtime_error *prVar24;
  size_type *psVar25;
  __nlink_t *p_Var26;
  _Rb_tree_color _Var27;
  ulong uVar28;
  Compression CVar29;
  int p;
  long lVar30;
  long lVar31;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> outHeaders;
  vector<partData,_std::allocator<partData>_> parts;
  MultiPartInputFile in;
  stat instats;
  stat outstats;
  MemOStream *local_260;
  allocator<char> local_249;
  char *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  partStats *local_220;
  ulong local_218;
  string *local_210;
  vector<double,_std::allocator<double>_> *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  float local_1e0;
  float local_1dc;
  MultiPartInputFile local_1d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  char *local_1b8;
  undefined1 local_1b0 [40];
  MemOStream *local_188;
  pointer local_180;
  pointer local_170;
  undefined1 local_120 [40];
  __dev_t local_f8;
  MemOStream *local_f0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  local_248 = outFileName;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"read ",5);
    if (inFileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x117530);
    }
    else {
      sVar13 = strlen(inFileName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,inFileName,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," as ",4);
    modeName_abi_cxx11_((string *)local_1b0,pixelMode);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_1b0._0_8_,local_1b0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"... ",4);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
    }
    std::ostream::flush();
  }
  local_220 = (partStats *)CONCAT44(local_220._4_4_,compression);
  iVar11 = Imf_3_4::globalThreadCount();
  iVar12 = 1;
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_1d8,inFileName,iVar11,true);
  if (part != -1) {
    iVar11 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar11 <= part) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>(local_50,inFileName,&local_249);
      plVar23 = (long *)std::__cxx11::string::append((char *)local_50);
      local_200._M_dataplus._M_p = (pointer)*plVar23;
      psVar25 = (size_type *)(plVar23 + 2);
      if ((size_type *)local_200._M_dataplus._M_p == psVar25) {
        local_200.field_2._M_allocated_capacity = *psVar25;
        local_200.field_2._8_8_ = plVar23[3];
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      }
      else {
        local_200.field_2._M_allocated_capacity = *psVar25;
      }
      local_200._M_string_length = plVar23[1];
      *plVar23 = (long)psVar25;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      iVar11 = Imf_3_4::MultiPartInputFile::parts();
      std::__cxx11::to_string(&local_70,iVar11);
      std::operator+(&local_240,&local_200,&local_70);
      plVar23 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_120._0_8_ = *plVar23;
      p_Var26 = (__nlink_t *)(plVar23 + 2);
      if ((__nlink_t *)local_120._0_8_ == p_Var26) {
        local_120._16_8_ = *p_Var26;
        local_120._24_8_ = plVar23[3];
        local_120._0_8_ = local_120 + 0x10;
      }
      else {
        local_120._16_8_ = *p_Var26;
      }
      local_120._8_8_ = plVar23[1];
      *plVar23 = (long)p_Var26;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      std::__cxx11::to_string(&local_90,part);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     &local_90);
      std::runtime_error::runtime_error(prVar24,(char *)local_1b0._0_8_);
      __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  memset(__return_storage_ptr__,0,0xb2);
  (__return_storage_ptr__->totalStats).sizeData.compression = NUM_COMPRESSION_METHODS;
  (__return_storage_ptr__->totalStats).sizeData.partType._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->totalStats).sizeData.partType.field_2;
  (__return_storage_ptr__->totalStats).sizeData.partType._M_string_length = 0;
  (__return_storage_ptr__->totalStats).sizeData.partType.field_2._M_local_buf[0] = '\0';
  if (part == -1) {
    iVar12 = Imf_3_4::MultiPartInputFile::parts();
  }
  local_1b8 = inFileName;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_240,(long)iVar12,
             (allocator_type *)local_1b0);
  CVar29 = (Compression)local_220;
  if (part == -1) {
    lVar31 = 0;
    lVar30 = 0;
    while( true ) {
      iVar11 = Imf_3_4::MultiPartInputFile::parts();
      if (iVar11 <= lVar30) break;
      pHVar15 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_1d8);
      Imf_3_4::Header::operator=((Header *)(local_240._M_dataplus._M_p + lVar31),pHVar15);
      lVar30 = lVar30 + 1;
      lVar31 = lVar31 + 0x38;
    }
  }
  else {
    pHVar15 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_1d8);
    Imf_3_4::Header::operator=((Header *)local_240._M_dataplus._M_p,pHVar15);
  }
  local_210 = (string *)&(__return_storage_ptr__->totalStats).sizeData.partType;
  local_1e0 = ABS(level);
  local_208 = (vector<double,_std::allocator<double>_> *)
              CONCAT71(local_208._1_7_,level < -1.0 || local_1e0 == INFINITY);
  local_1dc = (float)(int)level;
  local_260 = (MemOStream *)0x0;
  local_218 = 0;
  while( true ) {
    iVar11 = Imf_3_4::MultiPartInputFile::parts();
    if ((long)iVar11 <= (long)local_260) break;
    if ((int)CVar29 < 10) {
      pCVar16 = (Compression *)Imf_3_4::Header::compression();
      *pCVar16 = CVar29;
    }
    if ((char)local_208 == '\0') {
      piVar17 = (int *)Imf_3_4::Header::compression();
      if (*piVar17 - 2U < 2) {
        pfVar18 = (float *)Imf_3_4::Header::zipCompressionLevel();
        *pfVar18 = local_1dc;
      }
      else {
        if (1 < *piVar17 - 8U) goto LAB_0010d19f;
        pfVar18 = (float *)Imf_3_4::Header::dwaCompressionLevel();
        *pfVar18 = level;
      }
      local_218 = CONCAT71((int7)((ulong)pfVar18 >> 8),1);
    }
LAB_0010d19f:
    if (pixelMode != PIXELMODE_ORIGINAL) {
      Imf_3_4::Header::channels();
      p_Var19 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
      while( true ) {
        Imf_3_4::Header::channels();
        p_Var20 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
        if (p_Var19 == p_Var20) break;
        pcVar21 = strrchr((char *)(p_Var19 + 1),0x72);
        p_Var20 = (_Rb_tree_node_base *)(pcVar21 + 1);
        if (pcVar21 == (char *)0x0) {
          p_Var20 = p_Var19 + 1;
        }
        _Var27 = pixelMode;
        if (pixelMode == PIXELMODE_ALL_HALF) {
LAB_0010d284:
          p_Var19[9]._M_color = _Var27;
        }
        else {
          if (pixelMode == PIXELMODE_MIXED_HALF_FLOAT) {
            iVar11 = strcmp((char *)p_Var20,"R");
            _Var27 = _S_black;
            if (iVar11 != 0) {
              iVar11 = strcmp((char *)p_Var20,"G");
              if (iVar11 != 0) {
                iVar11 = strcmp((char *)p_Var20,"B");
                if (iVar11 != 0) {
                  iVar11 = strcmp((char *)p_Var20,"A");
                  if ((pixelMode & ~PIXELMODE_ALL_HALF) != PIXELMODE_ALL_FLOAT && iVar11 != 0)
                  goto LAB_0010d28b;
                  _Var27 = 2 - (iVar11 == 0);
                }
              }
            }
            goto LAB_0010d284;
          }
          _Var27 = 2;
          if ((pixelMode & ~PIXELMODE_ALL_HALF) == PIXELMODE_ALL_FLOAT) goto LAB_0010d284;
        }
LAB_0010d28b:
        p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
      }
    }
    local_260 = (MemOStream *)((long)local_260 + 1);
    CVar29 = (Compression)local_220;
  }
  if ((-1.0 <= level && local_1e0 != INFINITY) && ((local_218 & 1) == 0)) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar24,"-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
    __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar11 = 1;
  if (part == -1) {
    iVar11 = Imf_3_4::MultiPartInputFile::parts();
  }
  std::vector<partData,_std::allocator<partData>_>::vector
            ((vector<partData,_std::allocator<partData>_> *)&local_200,(long)iVar11,
             (allocator_type *)local_1b0);
  std::vector<partStats,_std::allocator<partStats>_>::resize
            (&__return_storage_ptr__->stats,
             ((long)(local_200._M_string_length - (long)local_200._M_dataplus._M_p) >> 4) *
             0x14c1bacf914c1bad);
  initAndReadFile(local_1d8,(vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_240,
                  part,(vector<partData,_std::allocator<partData>_> *)&local_200,
                  __return_storage_ptr__,reread);
  if (write) {
    if (local_248 == (char *)0x0) {
      Imf_3_4::OStream::OStream((OStream *)local_1b0,"<dummy>");
      sVar10 = local_240._M_string_length;
      _Var9._M_p = local_240._M_dataplus._M_p;
      local_1b0._0_8_ = &PTR__OStream_00115c10;
      local_188 = (MemOStream *)0x0;
      iVar11 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)local_120,(OStream *)local_1b0,(Header *)_Var9._M_p,
                 (int)(sVar10 - (long)_Var9._M_p >> 3) * -0x49249249,false,iVar11);
      writeFile((MultiPartOutputFile *)local_120,
                (vector<partData,_std::allocator<partData>_> *)&local_200,__return_storage_ptr__,
                false);
      local_260 = local_188;
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_120);
      Imf_3_4::OStream::~OStream((OStream *)local_1b0);
    }
    else {
      local_260 = (MemOStream *)0x0;
    }
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," write ",7);
      if (CVar29 != NUM_COMPRESSION_METHODS) {
        local_1b0._8_8_ = 0;
        local_1b0[0x10] = '\0';
        local_1b0._0_8_ = local_1b0 + 0x10;
        Imf_3_4::getCompressionNameFromId(CVar29,(string *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"compression ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)local_1b0._0_8_,local_1b0._8_8_);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"... ",4);
      std::ostream::flush();
    }
    if (0 < passes) {
      iVar11 = 0;
      do {
        if (passes != 1 && verbose) {
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar11);
          local_1b0[0] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_1b0,1);
          std::ostream::flush();
        }
        MemOStream::MemOStream((MemOStream *)local_1b0,(uint64_t)local_260);
        if (local_248 == (char *)0x0) {
          this_02 = (MultiPartOutputFile *)operator_new(0x10);
          sVar10 = local_240._M_string_length;
          _Var9._M_p = local_240._M_dataplus._M_p;
          iVar12 = Imf_3_4::globalThreadCount();
          Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                    (this_02,(OStream *)local_1b0,(Header *)_Var9._M_p,
                     (int)(sVar10 - (long)_Var9._M_p >> 3) * -0x49249249,false,iVar12);
        }
        else {
          this_02 = (MultiPartOutputFile *)operator_new(0x10);
          sVar10 = local_240._M_string_length;
          _Var9._M_p = local_240._M_dataplus._M_p;
          iVar12 = Imf_3_4::globalThreadCount();
          Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                    (this_02,local_248,(Header *)_Var9._M_p,
                     (int)(sVar10 - (long)_Var9._M_p >> 3) * -0x49249249,false,iVar12);
        }
        writeFile(this_02,(vector<partData,_std::allocator<partData>_> *)&local_200,
                  __return_storage_ptr__,true);
        (**(code **)(*(long *)this_02 + 8))(this_02);
        if (reread) {
          Imf_3_4::IStream::IStream((IStream *)local_120,"<memory>");
          local_120._0_8_ = &PTR__IStream_00115cb0;
          local_f8 = 0;
          local_f0 = (MemOStream *)local_1b0;
          if (local_248 == (char *)0x0) {
            this_03 = (MultiPartInputFile *)operator_new(0x20);
            iVar12 = Imf_3_4::globalThreadCount();
            Imf_3_4::MultiPartInputFile::MultiPartInputFile
                      (this_03,(IStream *)local_120,iVar12,true);
          }
          else {
            this_03 = (MultiPartInputFile *)operator_new(0x20);
            iVar12 = Imf_3_4::globalThreadCount();
            Imf_3_4::MultiPartInputFile::MultiPartInputFile(this_03,local_248,iVar12,true);
          }
          rereadFile(this_03,(vector<partData,_std::allocator<partData>_> *)&local_200,
                     __return_storage_ptr__);
          if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 0x18) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 0x18));
          }
          if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 8) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 8));
          }
          operator_delete(this_03,0x20);
          Imf_3_4::IStream::~IStream((IStream *)local_120);
        }
        local_1b0._0_8_ = &PTR__MemOStream_00115c60;
        if (local_180 != (pointer)0x0) {
          operator_delete(local_180,(long)local_170 - (long)local_180);
        }
        Imf_3_4::OStream::~OStream((OStream *)local_1b0);
        iVar11 = iVar11 + 1;
      } while (passes != iVar11);
    }
    stat(local_1b8,(stat *)local_1b0);
    __return_storage_ptr__->inputFileSize = (uint64_t)local_180;
    if (local_248 != (char *)0x0) {
      stat(local_248,(stat *)local_120);
      local_260 = local_f0;
    }
    __return_storage_ptr__->outputFileSize = (uint64_t)local_260;
  }
  ppVar22 = (__return_storage_ptr__->stats).
            super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_220 = &__return_storage_ptr__->totalStats;
  std::vector<double,_std::allocator<double>_>::operator=
            (&local_220->countReadPerf,&ppVar22->countReadPerf);
  this = &(__return_storage_ptr__->totalStats).readPerf;
  std::vector<double,_std::allocator<double>_>::operator=(this,&ppVar22->readPerf);
  local_208 = &(__return_storage_ptr__->totalStats).writePerf;
  std::vector<double,_std::allocator<double>_>::operator=(local_208,&ppVar22->writePerf);
  this_00 = &(__return_storage_ptr__->totalStats).countRereadPerf;
  std::vector<double,_std::allocator<double>_>::operator=(this_00,&ppVar22->countRereadPerf);
  this_01 = &(__return_storage_ptr__->totalStats).rereadPerf;
  std::vector<double,_std::allocator<double>_>::operator=(this_01,&ppVar22->rereadPerf);
  bVar7 = (ppVar22->sizeData).isTiled;
  uVar8 = *(undefined2 *)&(ppVar22->sizeData).field_0x22;
  CVar29 = (ppVar22->sizeData).compression;
  (__return_storage_ptr__->totalStats).sizeData.isDeep = (ppVar22->sizeData).isDeep;
  (__return_storage_ptr__->totalStats).sizeData.isTiled = bVar7;
  *(undefined2 *)&(__return_storage_ptr__->totalStats).sizeData.field_0x22 = uVar8;
  (__return_storage_ptr__->totalStats).sizeData.compression = CVar29;
  uVar4 = (ppVar22->sizeData).rawSize;
  uVar5 = (ppVar22->sizeData).pixelCount;
  uVar6 = (ppVar22->sizeData).tileCount;
  (__return_storage_ptr__->totalStats).sizeData.channelCount = (ppVar22->sizeData).channelCount;
  (__return_storage_ptr__->totalStats).sizeData.tileCount = uVar6;
  (__return_storage_ptr__->totalStats).sizeData.rawSize = uVar4;
  (__return_storage_ptr__->totalStats).sizeData.pixelCount = uVar5;
  std::__cxx11::string::_M_assign(local_210);
  ppVar22 = (__return_storage_ptr__->stats).
            super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(__return_storage_ptr__->stats).
                         super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppVar22 >> 6) *
                 -0x5555555555555555)) {
    uVar28 = 1;
    lVar31 = 0xc0;
    do {
      accumulate(this,(vector<double,_std::allocator<double>_> *)
                      ((long)&(ppVar22->readPerf).
                              super__Vector_base<double,_std::allocator<double>_> + lVar31));
      accumulate(&local_220->countReadPerf,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&(((__return_storage_ptr__->stats).
                           super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                           super__Vector_impl_data._M_start)->countReadPerf).
                         super__Vector_base<double,_std::allocator<double>_> + lVar31));
      accumulate(local_208,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&(((__return_storage_ptr__->stats).
                           super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                           super__Vector_impl_data._M_start)->writePerf).
                         super__Vector_base<double,_std::allocator<double>_> + lVar31));
      accumulate(this_01,(vector<double,_std::allocator<double>_> *)
                         ((long)&(((__return_storage_ptr__->stats).
                                   super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl
                                   .super__Vector_impl_data._M_start)->rereadPerf).
                                 super__Vector_base<double,_std::allocator<double>_> + lVar31));
      accumulate(this_00,(vector<double,_std::allocator<double>_> *)
                         ((long)&(((__return_storage_ptr__->stats).
                                   super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl
                                   .super__Vector_impl_data._M_start)->countRereadPerf).
                                 super__Vector_base<double,_std::allocator<double>_> + lVar31));
      ppVar22 = (__return_storage_ptr__->stats).
                super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1 = &(__return_storage_ptr__->totalStats).sizeData.channelCount;
      *puVar1 = *puVar1 + *(long *)((long)&(ppVar22->sizeData).channelCount + lVar31);
      plVar23 = (long *)((long)&(ppVar22->sizeData).rawSize + lVar31);
      lVar30 = plVar23[1];
      uVar4 = (__return_storage_ptr__->totalStats).sizeData.pixelCount;
      (__return_storage_ptr__->totalStats).sizeData.rawSize =
           (__return_storage_ptr__->totalStats).sizeData.rawSize + *plVar23;
      (__return_storage_ptr__->totalStats).sizeData.pixelCount = uVar4 + lVar30;
      puVar1 = &(__return_storage_ptr__->totalStats).sizeData.tileCount;
      *puVar1 = *puVar1 + *(long *)((long)&(ppVar22->sizeData).tileCount + lVar31);
      pbVar2 = &(__return_storage_ptr__->totalStats).sizeData.isDeep;
      *pbVar2 = (bool)(*pbVar2 | *(byte *)((long)&(ppVar22->sizeData).isDeep + lVar31));
      pbVar2 = &(__return_storage_ptr__->totalStats).sizeData.isTiled;
      *pbVar2 = (bool)(*pbVar2 | *(byte *)((long)&(ppVar22->sizeData).isTiled + lVar31));
      if (*(Compression *)((long)&(ppVar22->sizeData).compression + lVar31) !=
          (__return_storage_ptr__->totalStats).sizeData.compression) {
        (__return_storage_ptr__->totalStats).sizeData.compression = NUM_COMPRESSION_METHODS;
      }
      pcVar21 = *(char **)((long)&(ppVar22->sizeData).partType + lVar31 + 8U);
      pcVar3 = (char *)(__return_storage_ptr__->totalStats).sizeData.partType._M_string_length;
      if (pcVar21 == pcVar3) {
        if (pcVar21 != (char *)0x0) {
          iVar11 = bcmp(*(void **)((long)&(ppVar22->sizeData).partType + lVar31),*(void **)local_210
                        ,(size_t)pcVar21);
          if (iVar11 != 0) goto LAB_0010d9a0;
        }
      }
      else {
LAB_0010d9a0:
        std::__cxx11::string::_M_replace((ulong)local_210,0,pcVar3,0x110a61);
      }
      uVar28 = uVar28 + 1;
      ppVar22 = (__return_storage_ptr__->stats).
                super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar31 = lVar31 + 0xc0;
    } while (uVar28 < (ulong)(((long)(__return_storage_ptr__->stats).
                                     super__Vector_base<partStats,_std::allocator<partStats>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppVar22 >> 6)
                             * -0x5555555555555555));
  }
  if (verbose) {
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  std::vector<partData,_std::allocator<partData>_>::~vector
            ((vector<partData,_std::allocator<partData>_> *)&local_200);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_240);
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
  }
  if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
  }
  return __return_storage_ptr__;
}

Assistant:

fileMetrics
exrmetrics (
    const char*                        inFileName,
    const char*                        outFileName,
    int                                part,
    OPENEXR_IMF_NAMESPACE::Compression compression,
    float                              level,
    int                                passes,
    bool                               write,
    bool                               reread,
    PixelMode                          pixelMode,
    bool                               verbose)
{

    if (verbose)
    {
        cerr << "read " << inFileName;
        cerr << " as " << modeName (pixelMode) << "... ";
        cerr.flush ();
    }

    MultiPartInputFile in (inFileName);
    if (part != -1 && part >= in.parts ())
    {
        throw runtime_error ((string (inFileName) + " only contains " +
                              to_string (in.parts ()) +
                              " parts. Cannot copy part " + to_string (part))
                                 .c_str ());
    }
    fileMetrics metrics;

    //write all parts if part==-1, otherwise write single part specified
    vector<Header> outHeaders (part == -1 ? in.parts () : 1);
    if (part == -1)
    {
        for (int p = 0; p < in.parts (); ++p)
        {
            outHeaders[p] = in.header (p);
        }
    }
    else { outHeaders[0] = in.header (part); }

    bool compressionSet = false;

    for (int p = 0; p < in.parts (); ++p)
    {
        if (compression < NUM_COMPRESSION_METHODS)
        {
            outHeaders[p].compression () = compression;
        }

        if (!isinf (level) && level >= -1)
        {
            switch (outHeaders[p].compression ())
            {
                case DWAA_COMPRESSION:
                case DWAB_COMPRESSION:
                    outHeaders[p].dwaCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                case ZIP_COMPRESSION:
                case ZIPS_COMPRESSION:
                    outHeaders[p].zipCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                    //            case ZSTD_COMPRESSION :
                    //                outHeader.zstdCompressionLevel()=level;
                    //                break;
                default: break;
            }
        }

        if (pixelMode != PIXELMODE_ORIGINAL)
        {
            for (ChannelList::Iterator i = outHeaders[p].channels ().begin ();
                 i != outHeaders[p].channels ().end ();
                 ++i)
            {
                // find channel suffix within full channel name (so 'R' in 'layer.R')
                const char* name = i.name ();
                const char* dot  = strrchr (name, 'r');
                if (dot) { name = dot + 1; }

                if (pixelMode == PIXELMODE_ALL_HALF ||
                    (pixelMode == PIXELMODE_MIXED_HALF_FLOAT &&
                     (!strcmp (name, "R") || !strcmp (name, "G") ||
                      !strcmp (name, "B") || !strcmp (name, "A"))))
                {
                    i.channel ().type = HALF;
                }
                else if (
                    pixelMode == PIXELMODE_ALL_FLOAT ||
                    pixelMode == PIXELMODE_MIXED_HALF_FLOAT)
                {
                    i.channel ().type = FLOAT;
                }
            }
        }
    }

    // abort if level was set but no parts had a compression type with a level
    if (!isinf (level) && level >= -1 && !compressionSet)
    {
        throw runtime_error (
            "-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
    }

    vector<partData> parts (part == -1 ? in.parts () : 1);
    metrics.stats.resize (parts.size ());

    initAndReadFile (in, outHeaders, part, parts, metrics, reread);

    if (write)
    {

        //
        // when NOT writing to file, write to preallocated block of data
        // precompute the total datasize, so no memory reallocation is required
        //
        uint64_t fileSize = 0;
        if (!outFileName)
        {

            DummyOStream        tmp;
            MultiPartOutputFile out (
                tmp, outHeaders.data (), outHeaders.size ());
            writeFile (out, parts, metrics, false);
            fileSize = tmp.tellp ();
        }

        //
        // write to output; re-read output back to input
        //

        if (verbose)
        {
            cerr << " write ";
            if (compression != NUM_COMPRESSION_METHODS)
            {
                string name;
                getCompressionNameFromId (compression, name);
                cerr << "compression " << name;
            }
            cerr << "... ";
            cerr.flush ();
        }

        for (int i = 0; i < passes; ++i)
        {
            if (verbose && passes > 1)
            {
                cerr << i << ' ';
                cerr.flush ();
            }
            MemOStream           ostream (fileSize);
            MultiPartOutputFile* out;
            if (outFileName)
            {
                out = new MultiPartOutputFile (
                    outFileName, outHeaders.data (), outHeaders.size ());
            }
            else
            {
                out = new MultiPartOutputFile (
                    ostream, outHeaders.data (), outHeaders.size ());
            }
            writeFile (*out, parts, metrics, true);
            delete out;

            if (reread)
            {
                MemIStream          istream (ostream);
                MultiPartInputFile* in;
                if (outFileName) { in = new MultiPartInputFile (outFileName); }
                else { in = new MultiPartInputFile (istream); }

                rereadFile (*in, parts, metrics);

                delete in;
            }
        }

        struct stat instats, outstats;
        stat (inFileName, &instats);
        metrics.inputFileSize = instats.st_size;
        if (outFileName)
        {
            stat (outFileName, &outstats);
            metrics.outputFileSize = outstats.st_size;
        }
        else { metrics.outputFileSize = fileSize; }
    }

    //
    // sum across all parts
    //

    metrics.totalStats = metrics.stats[0];
    for (size_t i = 1; i < metrics.stats.size (); ++i)
    {
        accumulate (metrics.totalStats.readPerf, metrics.stats[i].readPerf);
        accumulate (
            metrics.totalStats.countReadPerf, metrics.stats[i].countReadPerf);
        accumulate (metrics.totalStats.writePerf, metrics.stats[i].writePerf);
        accumulate (metrics.totalStats.rereadPerf, metrics.stats[i].rereadPerf);
        accumulate (
            metrics.totalStats.countRereadPerf,
            metrics.stats[i].countRereadPerf);

        metrics.totalStats.sizeData.pixelCount +=
            metrics.stats[i].sizeData.pixelCount;
        metrics.totalStats.sizeData.channelCount +=
            metrics.stats[i].sizeData.channelCount;
        metrics.totalStats.sizeData.rawSize +=
            metrics.stats[i].sizeData.rawSize;
        metrics.totalStats.sizeData.tileCount +=
            metrics.stats[i].sizeData.tileCount;

        metrics.totalStats.sizeData.isDeep |= metrics.stats[i].sizeData.isDeep;
        metrics.totalStats.sizeData.isTiled |=
            metrics.stats[i].sizeData.isTiled;

        //check for mixed compression or part types within file

        if (metrics.stats[i].sizeData.compression !=
            metrics.totalStats.sizeData.compression)
        {
            metrics.totalStats.sizeData.compression = NUM_COMPRESSION_METHODS;
        }
        if (metrics.stats[i].sizeData.partType !=
            metrics.totalStats.sizeData.partType)
        {
            metrics.totalStats.sizeData.partType = "";
        }
    }

    if (verbose) { cerr << endl; }
    return metrics;
}